

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

size_t bundle_ring_length(ring_t *ring)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ring_t *in_RDI;
  uint32_t advance;
  uint pos;
  uint local_20;
  uint local_c;
  
  local_c = 0x10;
  while( true ) {
    bVar1 = deref(local_c,in_RDI);
    bVar2 = deref(local_c + 1,in_RDI);
    bVar3 = deref(local_c + 2,in_RDI);
    bVar4 = deref(local_c + 3,in_RDI);
    uVar5 = (uint)bVar1 << 0x18 | (uint)bVar2 << 0x10 | (uint)bVar3 << 8 | (uint)bVar4;
    if (uVar5 == 0) break;
    local_c = uVar5 + 4 + local_c;
  }
  if (in_RDI->len + in_RDI[1].len < (ulong)local_c) {
    local_20 = 0;
  }
  else {
    local_20 = local_c;
  }
  return (ulong)local_20;
}

Assistant:

static size_t bundle_ring_length(ring_t *ring)
{
    unsigned pos = 8+8;//goto first length field
    uint32_t advance = 0;
    do {
        advance = deref(pos+0, ring) << (8*3) |
                  deref(pos+1, ring) << (8*2) |
                  deref(pos+2, ring) << (8*1) |
                  deref(pos+3, ring) << (8*0);
        if(advance)
            pos += 4+advance;
    } while(advance);

    return pos <= (ring[0].len+ring[1].len) ? pos : 0;
}